

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

bool ImGui::InputTextMultiline
               (char *label,string *str,ImVec2 *size,ImGuiInputTextFlags flags,
               ImGuiInputTextCallback callback,void *user_data)

{
  bool bVar1;
  char *buf;
  size_type sVar2;
  string *local_50;
  InputTextCallback_UserData cb_user_data;
  void *user_data_local;
  ImGuiInputTextCallback callback_local;
  ImGuiInputTextFlags flags_local;
  ImVec2 *size_local;
  string *str_local;
  char *label_local;
  
  cb_user_data.ChainCallbackUserData = user_data;
  if ((flags & 0x40000U) == 0) {
    local_50 = str;
    cb_user_data.Str = (string *)callback;
    cb_user_data.ChainCallback = (ImGuiInputTextCallback)user_data;
    buf = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    (str);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            capacity(str);
    bVar1 = InputTextMultiline(label,buf,sVar2 + 1,size,flags | 0x40000,InputTextCallback,&local_50)
    ;
    return bVar1;
  }
  __assert_fail("(flags & ImGuiInputTextFlags_CallbackResize) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/misc/cpp/imgui_stdlib.cpp"
                ,0x34,
                "bool ImGui::InputTextMultiline(const char *, std::string *, const ImVec2 &, ImGuiInputTextFlags, ImGuiInputTextCallback, void *)"
               );
}

Assistant:

bool ImGui::InputTextMultiline(const char* label, std::string* str, const ImVec2& size, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputTextMultiline(label, (char*)str->c_str(), str->capacity() + 1, size, flags, InputTextCallback, &cb_user_data);
}